

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O2

void __thiscall RK_Individual::resetaPesos(RK_Individual *this,float valor)

{
  int iVar1;
  double *pdVar2;
  int i;
  long lVar3;
  
  iVar1 = this->number_of_edges;
  pdVar2 = this->weights;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    pdVar2[lVar3] = (double)valor;
  }
  return;
}

Assistant:

void RK_Individual::resetaPesos(float valor){
    for(int i=0; i< this->getNumEdges(); i++)
        this->weights[i] = valor;
}